

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
sync_call<void(libtorrent::aux::session_impl::*)(libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>),libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,entry **a,
          bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void> *a_1)

{
  io_context *ctx;
  undefined8 uVar1;
  undefined4 *in_R8;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::session_impl> s;
  bool local_91;
  exception_ptr local_90;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_88;
  exception_ptr local_78;
  undefined1 local_70 [48];
  entry *local_40;
  undefined4 local_38;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,this);
  if (local_88._M_ptr == (session_impl *)0x0) {
    local_70._0_4_ = 0x73;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_70);
  }
  local_70._0_8_ = &local_91;
  local_91 = false;
  local_70._8_8_ = &local_90;
  local_90._M_exception_object = (void *)0x0;
  ctx = (local_88._M_ptr)->m_io_context;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             (local_70 + 0x10),&local_88);
  local_40 = *(entry **)a_1;
  local_38 = *in_R8;
  local_70._32_8_ = f;
  local_70._40_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call<void(libtorrent::aux::session_impl::*)(libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>),libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>const&>(void(libtorrent::aux::session_impl::*)(libtorrent::bdecode_node_const*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>),libtorrent::bdecode_node_const*&&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::save_state_flags_tag,void>const&)const::_lambda()_1_>
            (ctx,(type *)local_70,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
  aux::torrent_wait(&local_91,local_88._M_ptr);
  if (local_90._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    return;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_78,&local_90);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_78);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

void session_handle::sync_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;

		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
	}